

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

llama_perf_context_data * __thiscall
llama_context::perf_get_data(llama_perf_context_data *__return_storage_ptr__,llama_context *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  __return_storage_ptr__->t_p_eval_ms = 0.0;
  __return_storage_ptr__->t_eval_ms = 0.0;
  __return_storage_ptr__->t_start_ms = 0.0;
  __return_storage_ptr__->t_load_ms = 0.0;
  __return_storage_ptr__->n_p_eval = 0;
  __return_storage_ptr__->n_eval = 0;
  lVar1 = this->t_load_us;
  __return_storage_ptr__->t_start_ms = (double)this->t_start_us * 0.001;
  __return_storage_ptr__->t_load_ms = (double)lVar1 * 0.001;
  lVar1 = this->t_eval_us;
  __return_storage_ptr__->t_p_eval_ms = (double)this->t_p_eval_us * 0.001;
  __return_storage_ptr__->t_eval_ms = (double)lVar1 * 0.001;
  uVar2 = this->n_eval;
  uVar3 = -(uint)(1 < this->n_p_eval);
  uVar4 = -(uint)(1 < (int)uVar2);
  __return_storage_ptr__->n_p_eval = ~uVar3 & 1 | this->n_p_eval & uVar3;
  __return_storage_ptr__->n_eval = ~uVar4 & 1 | uVar2 & uVar4;
  return __return_storage_ptr__;
}

Assistant:

llama_perf_context_data llama_context::perf_get_data() const {
    llama_perf_context_data data = {};

    data.t_start_ms  = 1e-3 * t_start_us;
    data.t_load_ms   = 1e-3 * t_load_us;
    data.t_p_eval_ms = 1e-3 * t_p_eval_us;
    data.t_eval_ms   = 1e-3 * t_eval_us;
    data.n_p_eval    = std::max(1, n_p_eval);
    data.n_eval      = std::max(1, n_eval);

    return data;
}